

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O3

int64_t duckdb::StringSliceOperations::ValueLength(string_t *value)

{
  long lVar1;
  ulong uVar2;
  
  if ((int)*(ulong *)&value->value != 0) {
    uVar2 = 0;
    lVar1 = 0;
    do {
      lVar1 = lVar1 + 1;
      uVar2 = uVar2 + 1;
    } while ((*(ulong *)&value->value & 0xffffffff) != uVar2);
    return lVar1;
  }
  return 0;
}

Assistant:

static int64_t ValueLength(const string_t &value) {
		return Length<string_t, int64_t>(value);
	}